

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_pushdown.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::FinishPushdown
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  undefined8 uVar4;
  pointer pLVar5;
  pointer in_RDX;
  pointer *__ptr;
  pointer puVar6;
  FilterPushdown pushdown;
  undefined1 local_170 [48];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_140;
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_128;
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
  local_b8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  local_88;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  local_48;
  
  local_170._16_8_ = in_RDX;
  local_170._24_8_ = this;
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_RDX);
  puVar6 = (pLVar5->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pLVar5->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    do {
      FilterPushdown((FilterPushdown *)(local_170 + 0x20),
                     (Optimizer *)
                     (op->
                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                     *(bool *)&op[0x20].
                               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    );
      _Var2._M_head_impl =
           (puVar6->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar6->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      Rewrite((FilterPushdown *)local_170,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)(local_170 + 0x20));
      uVar4 = local_170._0_8_;
      local_170._0_8_ = (Optimizer *)0x0;
      _Var3._M_head_impl =
           (puVar6->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar6->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar4;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
        if ((Optimizer *)local_170._0_8_ != (Optimizer *)0x0) {
          (*(code *)((*(ClientContext **)local_170._0_8_)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
      }
      local_170._0_8_ = (LogicalOperator *)0x0;
      if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
      ::~vector(&local_48);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
      ::~_Rb_tree(&local_88);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
      ::~_Rb_tree(&local_b8);
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f0);
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_128);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_140);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  uVar4 = local_170._24_8_;
  local_170._8_8_ =
       ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false> *)
       &(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
         local_170._16_8_)->_M_t).
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>)->_M_head_impl;
  ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false> *)
  &(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)local_170._16_8_)->
   _M_t).super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
   super__Head_base<0UL,_duckdb::Expression_*,_false>)->_M_head_impl = (LogicalOperator *)0x0;
  PushFinalFilters((FilterPushdown *)local_170._24_8_,op);
  if ((ClientContext *)local_170._8_8_ != (ClientContext *)0x0) {
    (*(*(_func_int ***)
        &((enable_shared_from_this<duckdb::ClientContext> *)local_170._8_8_)->__weak_this_)[1])();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )uVar4;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::FinishPushdown(unique_ptr<LogicalOperator> op) {
	// unhandled type, first perform filter pushdown in its children
	for (auto &child : op->children) {
		FilterPushdown pushdown(optimizer, convert_mark_joins);
		child = pushdown.Rewrite(std::move(child));
	}
	// now push any existing filters
	return PushFinalFilters(std::move(op));
}